

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall kj::Maybe<kj::String>::Maybe(Maybe<kj::String> *this,Maybe<kj::String> *other)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.content.ptr = (other->ptr).field_1.value.content.ptr;
    (this->ptr).field_1.value.content.size_ = (other->ptr).field_1.value.content.size_;
    (this->ptr).field_1.value.content.disposer = (other->ptr).field_1.value.content.disposer;
    (other->ptr).field_1.value.content.ptr = (char *)0x0;
    (other->ptr).field_1.value.content.size_ = 0;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    pcVar2 = (other->ptr).field_1.value.content.ptr;
    if (pcVar2 != (char *)0x0) {
      sVar3 = (other->ptr).field_1.value.content.size_;
      (other->ptr).field_1.value.content.ptr = (char *)0x0;
      (other->ptr).field_1.value.content.size_ = 0;
      pAVar4 = (other->ptr).field_1.value.content.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }